

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

void density_tests::detail::
     sp_queues_generic_tests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>
               (QueueTesterFlags i_flags,ostream *i_output,EasyRandom *i_random,
               size_t i_element_count,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *i_nonblocking_thread_counts)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  size_t sVar2;
  EasyRandom *pEVar3;
  QueueTesterFlags QVar4;
  bool bVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *i_nonblocking_thread_counts_local;
  size_t i_element_count_local;
  EasyRandom *i_random_local;
  ostream *i_output_local;
  QueueTesterFlags i_flags_local;
  
  local_30 = i_nonblocking_thread_counts;
  i_nonblocking_thread_counts_local =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)i_element_count;
  i_element_count_local = (size_t)i_random;
  i_random_local = (EasyRandom *)i_output;
  i_output_local._4_4_ = i_flags;
  bVar5 = operator&&(i_flags,eUseTestAllocators);
  QVar4 = i_output_local._4_4_;
  pEVar3 = i_random_local;
  sVar2 = i_element_count_local;
  pvVar1 = i_nonblocking_thread_counts_local;
  if (bVar5) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,local_30);
    single_lf_queue_generic_test<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)sVar2,(size_t)pvVar1,&local_48);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_48);
    QVar4 = i_output_local._4_4_;
    pEVar3 = i_random_local;
    sVar2 = i_element_count_local;
    pvVar1 = i_nonblocking_thread_counts_local;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_70,local_30);
    single_lf_queue_generic_test<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)sVar2,(size_t)pvVar1,&local_70);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_70);
    QVar4 = i_output_local._4_4_;
    pEVar3 = i_random_local;
    sVar2 = i_element_count_local;
    pvVar1 = i_nonblocking_thread_counts_local;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_88,local_30);
    single_lf_queue_generic_test<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)sVar2,(size_t)pvVar1,&local_88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_88);
    QVar4 = i_output_local._4_4_;
    pEVar3 = i_random_local;
    sVar2 = i_element_count_local;
    pvVar1 = i_nonblocking_thread_counts_local;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_a0,local_30);
    single_lf_queue_generic_test<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)sVar2,(size_t)pvVar1,&local_a0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_a0);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_b8,local_30);
    single_lf_queue_generic_test<density::sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)sVar2,(size_t)pvVar1,&local_b8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_b8);
  }
  return;
}

Assistant:

void sp_queues_generic_tests(
          QueueTesterFlags            i_flags,
          std::ostream &              i_output,
          EasyRandom &                i_random,
          size_t                      i_element_count,
          std::vector<size_t> const & i_nonblocking_thread_counts)
        {
            using namespace density;

            if (i_flags && QueueTesterFlags::eUseTestAllocators)
            {
                single_lf_queue_generic_test<sp_heter_queue<
                  runtime_type<>,
                  UnmovableFastTestAllocator<>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);

                single_lf_queue_generic_test<sp_heter_queue<
                  TestRuntimeTime<>,
                  DeepTestAllocator<>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);

                single_lf_queue_generic_test<sp_heter_queue<
                  runtime_type<>,
                  UnmovableFastTestAllocator<256>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);

                single_lf_queue_generic_test<sp_heter_queue<
                  TestRuntimeTime<>,
                  DeepTestAllocator<256>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);
            }
            else
            {
                single_lf_queue_generic_test<sp_heter_queue<
                  runtime_type<>,
                  default_allocator,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);
            }
        }